

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CopyClassExpressionSyntax::setChild
          (CopyClassExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (pSVar1 == (SyntaxNode *)0x0) {
    pSVar1 = (SyntaxNode *)0x0;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
  }
  (&this->scopedNew)[index != 0].ptr = (NameSyntax *)pSVar1;
  return;
}

Assistant:

void CopyClassExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: scopedNew = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}